

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

void __thiscall CGL::GLScene::Scene::update_selection(Scene *this,Vector2D *p,Matrix4x4 *worldTo3DH)

{
  int iVar1;
  ulong uVar2;
  pointer ppSVar3;
  iterator __begin3;
  pointer ppSVar4;
  double dVar5;
  ulong local_40;
  double local_38;
  
  ppSVar4 = (this->objects).
            super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppSVar3 = (this->objects).
            super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppSVar3 != ppSVar4) {
    local_40 = 0xffffffff;
    local_38 = -1.0;
    uVar2 = 0;
    do {
      dVar5 = local_38;
      (*ppSVar4[uVar2]->_vptr_SceneObject[4])(ppSVar4[uVar2],p,worldTo3DH);
      if (0.0 <= dVar5) {
        if (-1 < (int)local_40) {
          if (local_38 <= dVar5) goto LAB_0011aec4;
        }
        local_40 = uVar2 & 0xffffffff;
        local_38 = dVar5;
      }
LAB_0011aec4:
      uVar2 = uVar2 + 1;
      ppSVar4 = (this->objects).
                super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppSVar3 = (this->objects).
                super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while (uVar2 < (ulong)((long)ppSVar3 - (long)ppSVar4 >> 3));
    iVar1 = (int)local_40;
    if (iVar1 != -1) {
      if (0 < iVar1) {
        uVar2 = 0;
        do {
          (*(this->objects).
            super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar2]->_vptr_SceneObject[7])();
          uVar2 = uVar2 + 1;
        } while (local_40 != uVar2);
        ppSVar4 = (this->objects).
                  super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      (*ppSVar4[iVar1]->_vptr_SceneObject[5])();
      uVar2 = (ulong)(iVar1 + 1);
      while( true ) {
        ppSVar4 = (this->objects).
                  super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->objects).
                          super__Vector_base<CGL::GLScene::SceneObject_*,_std::allocator<CGL::GLScene::SceneObject_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar4 >> 3) <= uVar2)
        break;
        (*ppSVar4[uVar2]->_vptr_SceneObject[7])();
        uVar2 = uVar2 + 1;
      }
      goto LAB_0011af59;
    }
  }
  iVar1 = -1;
  for (; ppSVar4 != ppSVar3; ppSVar4 = ppSVar4 + 1) {
    (*(*ppSVar4)->_vptr_SceneObject[7])();
  }
LAB_0011af59:
  this->hoverIdx = iVar1;
  return;
}

Assistant:

void Scene::update_selection(const Vector2D& p, const Matrix4x4& worldTo3DH) {
  double minW = -1.0;
  int minI = -1;
  for (int i = 0; i < objects.size(); i++) {
    double newW = objects[i]->test_selection(p, worldTo3DH, minW);
    if (newW >= 0.0 && (minI < 0 || newW < minW)) {
      minI = i;
      minW = newW;
    }
  }
  if (minI == -1) {
    for (SceneObject *obj : objects) {
      obj->invalidate_hover();
    }
  } else {
    for (int i = 0; i < minI; i++) {
      objects[i]->invalidate_hover();
    }
    objects[minI]->confirm_hover();
    for (int i = minI + 1; i < objects.size(); i++) {
      objects[i]->invalidate_hover();
    }
  }
  hoverIdx = minI;
}